

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

int32 __thiscall nuraft::raft_server::get_dc_id(raft_server *this,int32 srv_id)

{
  int32 iVar1;
  ptr<srv_config> s_conf;
  ptr<cluster_config> c_conf;
  
  get_config((raft_server *)&c_conf);
  cluster_config::get_server
            ((cluster_config *)&s_conf,
             (int)c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  if (s_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = (s_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            dc_id_;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar1;
}

Assistant:

int32 raft_server::get_dc_id(int32 srv_id) const {
    ptr<cluster_config> c_conf = get_config();
    ptr<srv_config> s_conf = c_conf->get_server(srv_id);
    if (!s_conf) return -1; // Not found.

    return s_conf->get_dc_id();
}